

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_gear(void)

{
  wchar_t *pwVar1;
  byte bVar2;
  object *poVar3;
  int16_t iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  object *obj;
  object **in_RSI;
  object **ppoVar7;
  
  wVar5 = rd_gear_aux((rd_item_t)&player->gear,in_RSI);
  wVar6 = L'\xffffffff';
  if (wVar5 == L'\0') {
    wVar5 = rd_gear_aux((rd_item_t)&player->gear_k,in_RSI);
    if (wVar5 == L'\0') {
      obj = player->gear;
      if (obj != (object *)0x0) {
        ppoVar7 = &player->gear_k;
        do {
          poVar3 = *ppoVar7;
          obj->known = poVar3;
          bVar2 = obj->number;
          iVar4 = object_weight_one(obj);
          pwVar1 = &player->upkeep->total_weight;
          *pwVar1 = *pwVar1 + (int)iVar4 * (uint)bVar2;
          ppoVar7 = &poVar3->next;
          obj = obj->next;
        } while (obj != (object *)0x0);
      }
      calc_inventory(player);
      wVar6 = L'\0';
    }
  }
  return wVar6;
}

Assistant:

int rd_gear(void)
{
	struct object *obj, *known_obj;

	/* Get real gear */
	if (rd_gear_aux(rd_item, &player->gear))
		return -1;

	/* Get known gear */
	if (rd_gear_aux(rd_item, &player->gear_k))
		return -1;

	/* Align the two, add weight */
	for (obj = player->gear, known_obj = player->gear_k; obj;
		 obj = obj->next, known_obj = known_obj->next) {
		obj->known = known_obj;
		player->upkeep->total_weight +=
			obj->number * object_weight_one(obj);
	}

	calc_inventory(player);

	return 0;
}